

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgiszll(fitsfile *fptr,int nlen,LONGLONG *naxes,int *status)

{
  int iVar1;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  int naxis;
  int ii;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  int local_38;
  int local_34;
  int local_2c;
  int local_4;
  
  if (*in_RCX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000d8,in_stack_000000d0), 0 < iVar1)) {
        return *in_RCX;
      }
    }
    else {
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      local_34 = in_ESI;
      if (*(int *)(*(long *)(in_RDI + 2) + 0x90) < in_ESI) {
        local_34 = *(int *)(*(long *)(in_RDI + 2) + 0x90);
      }
      for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
        *(undefined8 *)(in_RDX + (long)local_2c * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 2) + 0x98 + (long)local_2c * 8);
      }
    }
    else if (*(int *)(*(long *)(in_RDI + 2) + 0x47c) == 0) {
      *in_RCX = 0xe9;
    }
    else {
      local_38 = in_ESI;
      if (*(int *)(*(long *)(in_RDI + 2) + 0x490) < in_ESI) {
        local_38 = *(int *)(*(long *)(in_RDI + 2) + 0x490);
      }
      for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
        *(undefined8 *)(in_RDX + (long)local_2c * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 2) + 0x498 + (long)local_2c * 8);
      }
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgiszll( fitsfile *fptr,  /* I - FITS file pointer                     */
            int nlen,          /* I - number of axes to return              */
            LONGLONG  *naxes,  /* O - size of image dimensions              */
            int  *status)      /* IO - error status                         */
/*
  Get the size of the image dimensions (= NAXISn keywords for normal image, or
  ZNAXISn for a compressed image)
*/
{
    int ii, naxis;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        naxis = minvalue((fptr->Fptr)->imgdim, nlen);
        for (ii = 0; ii < naxis; ii++)
        {
            naxes[ii] = (fptr->Fptr)->imgnaxis[ii];
        }
    }
    else if ((fptr->Fptr)->compressimg)
    {
        naxis = minvalue( (fptr->Fptr)->zndim, nlen);
        for (ii = 0; ii < naxis; ii++)
        {
            naxes[ii] = (fptr->Fptr)->znaxis[ii];
        }
    }
    else
    {
        *status = NOT_IMAGE;
    }

    return(*status);
}